

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMatrixX.h
# Opt level: O1

btMatrixX<float> * __thiscall
btMatrixX<float>::negative(btMatrixX<float> *__return_storage_ptr__,btMatrixX<float> *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  float *pfVar4;
  float *pfVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  
  btMatrixX(__return_storage_ptr__,this->m_rows,this->m_cols);
  iVar1 = this->m_rows;
  if (0 < (long)iVar1) {
    uVar2 = this->m_cols;
    pfVar4 = (this->m_storage).m_data;
    iVar3 = __return_storage_ptr__->m_cols;
    pfVar5 = (__return_storage_ptr__->m_storage).m_data;
    iVar6 = __return_storage_ptr__->m_setElemOperations;
    lVar7 = 0;
    do {
      if (0 < (int)uVar2) {
        uVar8 = 0;
        do {
          pfVar5[uVar8] = -pfVar4[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
        iVar6 = iVar6 + uVar2;
        __return_storage_ptr__->m_setElemOperations = iVar6;
      }
      lVar7 = lVar7 + 1;
      pfVar5 = pfVar5 + iVar3;
      pfVar4 = pfVar4 + (int)uVar2;
    } while (lVar7 != iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

btMatrixX negative()
	{
		btMatrixX neg(rows(),cols());
		for (int i=0;i<rows();i++)
			for (int j=0;j<cols();j++)
			{
				T v = (*this)(i,j);
				neg.setElem(i,j,-v);
			}
		return neg;
	}